

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O3

int mp_count_bits(mp_int *a)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  
  iVar1 = a->used;
  if ((long)iVar1 == 0) {
    iVar4 = 0;
  }
  else {
    iVar4 = (iVar1 + -1) * 0x3c;
    uVar2 = a->dp[(long)iVar1 + -1];
    if (uVar2 != 0) {
      lVar3 = 0x3f;
      if (uVar2 != 0) {
        for (; uVar2 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      return (iVar4 - ((uint)lVar3 ^ 0x3f)) + 0x40;
    }
  }
  return iVar4;
}

Assistant:

int mp_count_bits (mp_int * a)
{
  int     r;
  mp_digit q;

  /* shortcut */
  if (a->used == 0) {
    return 0;
  }

  /* get number of digits and add that */
  r = (a->used - 1) * DIGIT_BIT;
  
  /* take the last digit and count the bits in it */
  q = a->dp[a->used - 1];
  while (q > ((mp_digit) 0)) {
    ++r;
    q >>= ((mp_digit) 1);
  }
  return r;
}